

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,render_handler *handler,
      context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *ctx,bool root_renderer)

{
  pointer pcVar1;
  walk_control wVar2;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *child
  ;
  pointer this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(render_handler **)local_50._M_unused._0_8_ = handler;
  *(context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    **)((long)local_50._M_unused._0_8_ + 8) = ctx;
  *(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  local_38 = Catch::clara::std::
             _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:966:39)>
             ::_M_invoke;
  local_40 = Catch::clara::std::
             _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:966:39)>
             ::_M_manager;
  this_00 = (this->root_component_).children.
            super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->root_component_).children.
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pcVar1) {
    do {
      wVar2 = component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::walk(this_00,(walk_callback *)&local_50);
      if (wVar2 != walk) break;
      this_00 = this_00 + 1;
    } while (this_00 != pcVar1);
    if (local_40 == (code *)0x0) goto LAB_001de181;
  }
  (*local_40)(&local_50,&local_50,__destroy_functor);
LAB_001de181:
  if (root_renderer) {
    render_current_line(this,handler,ctx,
                        (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0);
  }
  return;
}

Assistant:

void render(const render_handler& handler, context_internal<string_type>& ctx, bool root_renderer = true) {
        root_component_.walk_children([&handler, &ctx, this](component<string_type>& comp) -> typename component<string_type>::walk_control {
            return render_component(handler, ctx, comp);
        });
        // process the last line, but only for the top-level renderer
        if (root_renderer) {
            render_current_line(handler, ctx, nullptr);
        }
    }